

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::GenerateBlockSymbol*>::
emplace_back<slang::ast::GenerateBlockSymbol*const&>
          (SmallVectorBase<slang::ast::GenerateBlockSymbol*> *this,GenerateBlockSymbol **args)

{
  iterator ppGVar1;
  GenerateBlockSymbol **args_local;
  SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppGVar1 = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::end
                        ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
    this_local = (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                 emplaceRealloc<slang::ast::GenerateBlockSymbol*const&>(this,ppGVar1,args);
  }
  else {
    ppGVar1 = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::end
                        ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
    *ppGVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                 SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::back
                           ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }